

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_strpbrk(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  sxi32 sVar2;
  char *zStr;
  char *pcVar3;
  sxu32 sVar4;
  long lVar5;
  uint uVar6;
  sxu32 nMax;
  int iListLen;
  int iLen;
  jx9_context *local_38;
  
  if (1 < nArg) {
    zStr = jx9_value_to_string(*apArg,&iLen);
    pcVar3 = jx9_value_to_string(apArg[1],&iListLen);
    iVar1 = iLen;
    if (0 < iLen) {
      nMax = 0xffffffff;
      uVar6 = 0xffffffff;
      local_38 = pCtx;
      for (lVar5 = 0; lVar5 < iListLen; lVar5 = lVar5 + 1) {
        sVar2 = SyByteFind(zStr,iLen,(int)pcVar3[lVar5],&nMax);
        sVar4 = nMax;
        if (uVar6 <= nMax) {
          sVar4 = uVar6;
        }
        if (sVar2 == 0) {
          uVar6 = sVar4;
        }
      }
      pCtx = local_38;
      if (uVar6 != 0xffffffff) {
        jx9_result_string(local_38,zStr + uVar6,iVar1 - uVar6);
        return 0;
      }
    }
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_strpbrk(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zList, *zEnd;
	int iLen, iListLen, i, c;
	sxu32 nOfft, nMax;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the haystack and the char list */
	zString = jx9_value_to_string(apArg[0], &iLen);
	zList = jx9_value_to_string(apArg[1], &iListLen);
	if( iLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the end of the string */
	zEnd = &zString[iLen];
	nOfft = nMax = SXU32_HIGH;
	/* perform the requested operation */
	for( i = 0 ; i < iListLen ; i++ ){
		c = zList[i];
		rc = SyByteFind(zString, (sxu32)iLen, c, &nMax);
		if( rc == SXRET_OK ){
			if( nMax < nOfft ){
				nOfft = nMax;
			}
		}
	}
	if( nOfft == SXU32_HIGH ){
		/* No such substring, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return the substring */
		jx9_result_string(pCtx, &zString[nOfft], (int)(zEnd-&zString[nOfft]));
	}
	return JX9_OK;
}